

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O3

TermList ApplicativeHelper::getHead(TermList t)

{
  bool bVar1;
  TermList in_RDI;
  TermList local_18;
  
  local_18._content = in_RDI._content;
  if ((in_RDI._content & 3) == 0) {
    do {
      bVar1 = Kernel::TermList::isApplication(&local_18);
      if (!bVar1) {
        return (TermList)local_18._content;
      }
      in_RDI._content =
           *(ulong *)(local_18._content + 0x18 +
                     (ulong)(*(uint *)(local_18._content + 0xc) & 0xfffffff) * 8);
      if ((in_RDI._content & 3) != 0) {
        return (TermList)in_RDI._content;
      }
      local_18._content = in_RDI._content;
    } while (*(uint *)(in_RDI._content + 8) < 0xfffffff9);
  }
  return (TermList)in_RDI._content;
}

Assistant:

TermList ApplicativeHelper::getHead(TermList t)
{
  if(!t.isTerm()){
    return t; 
  }

  while(t.isApplication()){
    t = *t.term()->nthArgument(2);
    if(!t.isTerm() || t.term()->isSpecial()){ break; } 
  }
  return t;
}